

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O3

Reals __thiscall Omega_h::resize_vectors(Omega_h *this,Reals *old_vectors,Int old_dim,Int new_dim)

{
  int *piVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  Alloc *this_00;
  void *pvVar11;
  Alloc *pAVar12;
  void *pvVar13;
  Reals RVar14;
  IntIterator last;
  Write<double> new_vectors;
  type f;
  Write<double> local_c8;
  uint local_ac;
  Alloc *local_a8;
  void *local_a0;
  Write<double> local_98;
  string local_88;
  Alloc *local_68;
  void *local_60;
  Int local_58;
  Alloc *local_50;
  Alloc *local_48;
  long local_40;
  size_t local_38;
  
  pvVar11 = (void *)CONCAT44(in_register_00000014,old_dim);
  pAVar12 = (old_vectors->write_).shared_alloc_.alloc;
  if (old_dim == new_dim) {
    *(Alloc **)this = pAVar12;
    *(void **)(this + 8) = (old_vectors->write_).shared_alloc_.direct_ptr;
    if ((((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar12->use_count = pAVar12->use_count + -1;
      *(size_t *)this = pAVar12->size * 8 + 1;
    }
    (old_vectors->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (old_vectors->write_).shared_alloc_.direct_ptr = (void *)0x0;
    goto LAB_004130cb;
  }
  if (((ulong)pAVar12 & 1) == 0) {
    sVar8 = pAVar12->size;
  }
  else {
    sVar8 = (ulong)pAVar12 >> 3;
  }
  iVar3 = divide_no_remainder<int>((int)(sVar8 >> 3),old_dim);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  Write<double>::Write(&local_c8,iVar3 * new_dim,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  uVar9 = (ulong)(uint)old_dim;
  if (new_dim < old_dim) {
    uVar9 = (ulong)(uint)new_dim;
  }
  uVar7 = (uint)uVar9;
  local_88._M_dataplus._M_p._0_4_ = uVar7;
  local_88._M_string_length = (size_type)local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88._M_string_length = (local_c8.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0 = local_c8.shared_alloc_.direct_ptr;
  local_88.field_2._M_allocated_capacity = (size_type)local_c8.shared_alloc_.direct_ptr;
  local_68 = (old_vectors->write_).shared_alloc_.alloc;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  pvVar11 = (old_vectors->write_).shared_alloc_.direct_ptr;
  pAVar12 = (Alloc *)local_88._M_string_length;
  if ((local_88._M_string_length & 7) == 0 && (Alloc *)local_88._M_string_length != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar12 = (Alloc *)(*(size_t *)local_88._M_string_length * 8 + 1);
    }
    else {
      *(int *)(local_88._M_string_length + 0x30) = *(int *)(local_88._M_string_length + 0x30) + 1;
    }
  }
  this_00 = local_68;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      this_00 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  local_88.field_2._8_4_ = new_dim;
  local_60 = pvVar11;
  local_58 = old_dim;
  if (iVar3 < 1) {
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) goto LAB_00412f9d;
  }
  else {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12->use_count = pAVar12->use_count + -1;
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    local_a8 = this_00;
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      this_00->use_count = this_00->use_count + -1;
      local_a8 = (Alloc *)(this_00->size * 8 + 1);
    }
    entering_parallel = '\0';
    local_38 = (ulong)(~uVar7 + new_dim) * 8 + 8;
    lVar5 = (long)new_dim << 3;
    iVar6 = 0;
    uVar10 = uVar9;
    pvVar13 = local_c8.shared_alloc_.direct_ptr;
    local_ac = uVar7;
    local_50 = pAVar12;
    local_48 = (Alloc *)this;
    local_40 = lVar5;
    do {
      if (0 < (int)uVar10) {
        uVar4 = 0;
        do {
          *(undefined8 *)((long)pvVar13 + uVar4 * 8) = *(undefined8 *)((long)pvVar11 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      if (old_dim < new_dim) {
        memset((void *)((long)local_a0 + (long)(iVar6 * new_dim + (int)uVar10) * 8),0,local_38);
        uVar10 = (ulong)local_ac;
        lVar5 = local_40;
      }
      pAVar12 = local_a8;
      iVar6 = iVar6 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar5);
      pvVar11 = (void *)((long)pvVar11 + (long)old_dim * 8);
    } while (iVar3 != iVar6);
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      piVar1 = &local_a8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8);
        operator_delete(pAVar12,0x48);
      }
    }
    pAVar12 = local_50;
    this = (Omega_h *)local_48;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
LAB_00412f9d:
      piVar1 = &pAVar12->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
  }
  local_98.shared_alloc_.alloc = local_c8.shared_alloc_.alloc;
  local_98.shared_alloc_.direct_ptr = local_c8.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
       local_c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + -1;
    local_98.shared_alloc_.alloc = (Alloc *)((local_c8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_c8.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_98);
  pAVar12 = local_98.shared_alloc_.alloc;
  pvVar11 = extraout_RDX;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
      pvVar11 = extraout_RDX_00;
    }
  }
  pAVar12 = local_68;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    piVar1 = &local_68->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68);
      operator_delete(pAVar12,0x48);
      pvVar11 = extraout_RDX_01;
    }
  }
  sVar2 = local_88._M_string_length;
  if ((local_88._M_string_length & 7) == 0 && (Alloc *)local_88._M_string_length != (Alloc *)0x0) {
    piVar1 = (int *)(local_88._M_string_length + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_88._M_string_length);
      operator_delete((void *)sVar2,0x48);
      pvVar11 = extraout_RDX_02;
    }
  }
  pAVar12 = local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
      pvVar11 = extraout_RDX_03;
    }
  }
LAB_004130cb:
  RVar14.write_.shared_alloc_.direct_ptr = pvVar11;
  RVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar14.write_.shared_alloc_;
}

Assistant:

Reals resize_vectors(Reals old_vectors, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_vectors;
  auto nv = divide_no_remainder(old_vectors.size(), old_dim);
  Write<Real> new_vectors(nv * new_dim);
  auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    for (Int j = 0; j < min_dim; ++j) {
      new_vectors[i * new_dim + j] = old_vectors[i * old_dim + j];
    }
    for (Int j = min_dim; j < new_dim; ++j) {
      new_vectors[i * new_dim + j] = 0.0;
    }
  };
  parallel_for(nv, f, "resize_vectors");
  return new_vectors;
}